

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

void cf_socket_active(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  cf_socket_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  cf->conn->sock[cf->sockindex] = *(curl_socket_t *)((long)pvVar1 + 0x98);
  if (cf->sockindex == 0) {
    cf->conn->remote_addr = (Curl_sockaddr_ex *)((long)pvVar1 + 8);
    cf->conn->bits =
         (ConnectBits)
         ((uint)cf->conn->bits & 0xffffefff | (uint)(*(int *)((long)pvVar1 + 8) == 10) << 0xc);
    conn_set_primary_ip(cf,data);
    set_local_ip(cf,data);
    Curl_persistconninfo
              (data,cf->conn,(char *)((long)pvVar1 + 0x114),*(int *)((long)pvVar1 + 0x144));
    *(byte *)((long)pvVar1 + 0x17c) = *(byte *)((long)pvVar1 + 0x17c) & 0xef;
  }
  *(byte *)((long)pvVar1 + 0x17c) = *(byte *)((long)pvVar1 + 0x17c) & 0xf7 | 8;
  return;
}

Assistant:

static void cf_socket_active(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct cf_socket_ctx *ctx = cf->ctx;

  /* use this socket from now on */
  cf->conn->sock[cf->sockindex] = ctx->sock;
  /* the first socket info gets set at conn and data */
  if(cf->sockindex == FIRSTSOCKET) {
    cf->conn->remote_addr = &ctx->addr;
  #ifdef ENABLE_IPV6
    cf->conn->bits.ipv6 = (ctx->addr.family == AF_INET6)? TRUE : FALSE;
  #endif
    conn_set_primary_ip(cf, data);
    set_local_ip(cf, data);
    Curl_persistconninfo(data, cf->conn, ctx->l_ip, ctx->l_port);
    /* buffering is currently disabled by default because we have stalls
     * in parallel transfers where not all buffered data is consumed and no
     * socket events happen.
     */
    ctx->buffer_recv = FALSE;
  }
  ctx->active = TRUE;
}